

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computePostequiExpVecs
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *preRowscale,
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               *preColscale,DataArray<int> *rowscaleExp,DataArray<int> *colscaleExp,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  DataArray<int> *scaleExp;
  bool rowRatio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  
  rowRatio = SUB81(colscaleExp,0);
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&colratio,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preRowscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x0,rowRatio);
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&rowratio,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preColscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x1,rowRatio);
  tVar1 = boost::multiprecision::operator<(&colratio,&rowratio);
  if (tVar1) {
    local_d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
    local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
    local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2)
    ;
    local_d8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
    local_d8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
    local_d8.m_backend.exp = (epsilon->m_backend).exp;
    local_d8.m_backend.neg = (epsilon->m_backend).neg;
    local_d8.m_backend.fpclass = (epsilon->m_backend).fpclass;
    local_d8.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
    computeEquiExpVec(&(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,preRowscale,colscaleExp,&local_d8);
    local_118.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
    epsilon_00 = &local_118;
    local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
    local_118.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
    local_118.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
    local_118.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
    local_118.m_backend.exp = (epsilon->m_backend).exp;
    local_118.m_backend.neg = (epsilon->m_backend).neg;
    local_118.m_backend.fpclass = (epsilon->m_backend).fpclass;
    local_118.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
    scaleExp = rowscaleExp;
  }
  else {
    local_158.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
    local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
    local_158.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
    local_158.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
    local_158.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
    local_158.m_backend.exp = (epsilon->m_backend).exp;
    local_158.m_backend.neg = (epsilon->m_backend).neg;
    local_158.m_backend.fpclass = (epsilon->m_backend).fpclass;
    local_158.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
    computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)lp,preColscale,rowscaleExp,&local_158);
    lp = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_198.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
    epsilon_00 = &local_198;
    local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
    local_198.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
    local_198.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
    local_198.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
    local_198.m_backend.exp = (epsilon->m_backend).exp;
    local_198.m_backend.neg = (epsilon->m_backend).neg;
    local_198.m_backend.fpclass = (epsilon->m_backend).fpclass;
    local_198.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
    scaleExp = colscaleExp;
    colscaleExp = rowscaleExp;
  }
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)lp,colscaleExp,scaleExp,epsilon_00);
  return;
}

Assistant:

void SPxEquiliSC<R>::computePostequiExpVecs(const SPxLPBase<R>& lp,
      const std::vector<R>& preRowscale, const std::vector<R>& preColscale,
      DataArray<int>& rowscaleExp, DataArray<int>& colscaleExp, R epsilon)
{
   const R colratio = maxPrescaledRatio(lp, preRowscale, false);
   const R rowratio = maxPrescaledRatio(lp, preColscale, true);

   const bool colFirst = colratio < rowratio;

   // see SPxEquiliSC<R>::scale for reason behind this branch
   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), preRowscale, colscaleExp, epsilon);
      computeEquiExpVec(lp.rowSet(), colscaleExp, rowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), preColscale, rowscaleExp, epsilon);
      computeEquiExpVec(lp.colSet(), rowscaleExp, colscaleExp, epsilon);
   }
}